

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_duplicate.cpp
# Opt level: O2

int main(void)

{
  uint __line;
  int iVar1;
  char *__assertion;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  allocator_type local_b9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> e3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> e2;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  undefined8 local_2c;
  undefined4 local_24;
  vector<unsigned_int,_std::allocator<unsigned_int>_> e1;
  
  e2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x400000003;
  e2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x400000001;
  e2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._0_4_ = 5;
  __l._M_len = 5;
  __l._M_array = (iterator)&e2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&e1,__l,(allocator_type *)&e3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&e1);
  iVar1 = find_duplicate((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
  if (iVar1 == 4) {
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    e3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x200000001;
    e3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x400000003;
    e3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x100000005;
    __l_00._M_len = 6;
    __l_00._M_array = (iterator)&e3;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&e2,__l_00,(allocator_type *)&local_2c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,&e2);
    iVar1 = find_duplicate((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60);
    if (iVar1 == 1) {
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
      local_2c = 0x200000001;
      local_24 = 3;
      __l_01._M_len = 3;
      __l_01._M_array = (iterator)&local_2c;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&e3,__l_01,&local_b9);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,&e3);
      iVar1 = find_duplicate((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
      if (iVar1 == -1) {
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&e3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&e2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&e1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        return 0;
      }
      __assertion = "find_duplicate(e3) == -1";
      __line = 0x1b;
    }
    else {
      __assertion = "find_duplicate(e2) == 1";
      __line = 0x18;
    }
  }
  else {
    __assertion = "find_duplicate(e1) == 4";
    __line = 0x15;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/lukasmartinelli[P]sharpen/challenges/array/array_duplicate.cpp"
                ,__line,"int main()");
}

Assistant:

int main() {
    std::vector<uint32_t> e1 = {3, 4, 1, 4, 5};
    assert(find_duplicate(e1) == 4);

    std::vector<uint32_t> e2 = {1, 2, 3, 4, 5, 1};
    assert(find_duplicate(e2) == 1);

    std::vector<uint32_t> e3 = {1, 2, 3};
    assert(find_duplicate(e3) == -1);
}